

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

int nghttp2_nv_array_copy(nghttp2_nv **nva_ptr,nghttp2_nv *nva,size_t nvlen,nghttp2_mem *mem)

{
  nghttp2_nv *pnVar1;
  nghttp2_nv *local_50;
  nghttp2_nv *p;
  size_t buflen;
  uint8_t *data;
  size_t i;
  nghttp2_mem *mem_local;
  size_t nvlen_local;
  nghttp2_nv *nva_local;
  nghttp2_nv **nva_ptr_local;
  
  p = (nghttp2_nv *)0x0;
  if (nvlen == 0) {
    *nva_ptr = (nghttp2_nv *)0x0;
    nva_ptr_local._4_4_ = 0;
  }
  else {
    for (data = (uint8_t *)0x0; data < nvlen; data = data + 1) {
      if ((nva[(long)data].flags & 2) == 0) {
        p = (nghttp2_nv *)((long)&p->name + nva[(long)data].namelen + 1);
      }
      if ((nva[(long)data].flags & 4) == 0) {
        p = (nghttp2_nv *)((long)&p->name + nva[(long)data].valuelen + 1);
      }
    }
    pnVar1 = (nghttp2_nv *)nghttp2_mem_malloc(mem,(size_t)(p + nvlen));
    *nva_ptr = pnVar1;
    if (*nva_ptr == (nghttp2_nv *)0x0) {
      nva_ptr_local._4_4_ = -0x385;
    }
    else {
      local_50 = *nva_ptr;
      buflen = (size_t)(*nva_ptr + nvlen);
      for (data = (uint8_t *)0x0; data < nvlen; data = data + 1) {
        local_50->flags = nva[(long)data].flags;
        if ((nva[(long)data].flags & 2) == 0) {
          if (nva[(long)data].namelen != 0) {
            memcpy((void *)buflen,nva[(long)data].name,nva[(long)data].namelen);
          }
          local_50->name = (uint8_t *)buflen;
          local_50->namelen = nva[(long)data].namelen;
          *(undefined1 *)(buflen + local_50->namelen) = 0;
          nghttp2_downcase(local_50->name,local_50->namelen);
          buflen = nva[(long)data].namelen + 1 + buflen;
        }
        else {
          local_50->name = nva[(long)data].name;
          local_50->namelen = nva[(long)data].namelen;
        }
        if ((nva[(long)data].flags & 4) == 0) {
          if (nva[(long)data].valuelen != 0) {
            memcpy((void *)buflen,nva[(long)data].value,nva[(long)data].valuelen);
          }
          local_50->value = (uint8_t *)buflen;
          local_50->valuelen = nva[(long)data].valuelen;
          *(undefined1 *)(buflen + local_50->valuelen) = 0;
          buflen = nva[(long)data].valuelen + 1 + buflen;
        }
        else {
          local_50->value = nva[(long)data].value;
          local_50->valuelen = nva[(long)data].valuelen;
        }
        local_50 = local_50 + 1;
      }
      nva_ptr_local._4_4_ = 0;
    }
  }
  return nva_ptr_local._4_4_;
}

Assistant:

int nghttp2_nv_array_copy(nghttp2_nv **nva_ptr, const nghttp2_nv *nva,
                          size_t nvlen, nghttp2_mem *mem) {
  size_t i;
  uint8_t *data = NULL;
  size_t buflen = 0;
  nghttp2_nv *p;

  if (nvlen == 0) {
    *nva_ptr = NULL;

    return 0;
  }

  for (i = 0; i < nvlen; ++i) {
    /* + 1 for null-termination */
    if ((nva[i].flags & NGHTTP2_NV_FLAG_NO_COPY_NAME) == 0) {
      buflen += nva[i].namelen + 1;
    }
    if ((nva[i].flags & NGHTTP2_NV_FLAG_NO_COPY_VALUE) == 0) {
      buflen += nva[i].valuelen + 1;
    }
  }

  buflen += sizeof(nghttp2_nv) * nvlen;

  *nva_ptr = nghttp2_mem_malloc(mem, buflen);

  if (*nva_ptr == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  p = *nva_ptr;
  data = (uint8_t *)(*nva_ptr) + sizeof(nghttp2_nv) * nvlen;

  for (i = 0; i < nvlen; ++i) {
    p->flags = nva[i].flags;

    if (nva[i].flags & NGHTTP2_NV_FLAG_NO_COPY_NAME) {
      p->name = nva[i].name;
      p->namelen = nva[i].namelen;
    } else {
      if (nva[i].namelen) {
        memcpy(data, nva[i].name, nva[i].namelen);
      }
      p->name = data;
      p->namelen = nva[i].namelen;
      data[p->namelen] = '\0';
      nghttp2_downcase(p->name, p->namelen);
      data += nva[i].namelen + 1;
    }

    if (nva[i].flags & NGHTTP2_NV_FLAG_NO_COPY_VALUE) {
      p->value = nva[i].value;
      p->valuelen = nva[i].valuelen;
    } else {
      if (nva[i].valuelen) {
        memcpy(data, nva[i].value, nva[i].valuelen);
      }
      p->value = data;
      p->valuelen = nva[i].valuelen;
      data[p->valuelen] = '\0';
      data += nva[i].valuelen + 1;
    }

    ++p;
  }
  return 0;
}